

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  bool bVar1;
  Builder *params;
  Builder *params_00;
  Reader value;
  Array<char> local_168;
  Builder root;
  Builder local_128;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnion>
            (&root,&builder.super_MessageBuilder);
  *(undefined2 *)root._builder.data = 3;
  *(undefined2 *)((long)root._builder.data + 8) = 0x7b;
  local_128._builder.dataSize = root._builder.dataSize;
  local_128._builder.pointerCount = root._builder.pointerCount;
  local_128._builder._38_2_ = root._builder._38_2_;
  local_128._builder.data = root._builder.data;
  local_128._builder.pointers = root._builder.pointers;
  local_128._builder.segment = root._builder.segment;
  local_128._builder.capTable = root._builder.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f0sp(&local_128,value);
  *(undefined2 *)((long)root._builder.data + 4) = 0;
  *(byte *)((long)root._builder.data + 0x20) = *(byte *)((long)root._builder.data + 0x20) | 1;
  *(undefined2 *)((long)root._builder.data + 6) = 4;
  *(undefined8 *)((long)root._builder.data + 0x38) = 0x1b69b4ba630f34e;
  kj::str<capnproto_test::capnp::test::TestUnion::Builder&>((String *)&local_128,(kj *)&root,params)
  ;
  bVar1 = kj::operator==("(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                         ,(String *)&local_128);
  kj::Array<char>::~Array((Array<char> *)&local_128);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
              ((String *)&local_128,(kj *)&root,params_00);
    kj::_::Debug::log<char_const(&)[290],char_const(&)[230],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x255,ERROR,
               "\"failed: expected \" \"(\\\"(\\\" \\\"union0 = (u0f0s16 = 123), \\\" \\\"union1 = (u1f0sp = \\\\\\\"foo\\\\\\\"), \\\" \\\"union2 = (u2f0s1 = true), \\\" \\\"union3 = (u3f0s64 = 123456789012345678), \\\" \\\"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \\\" \\\"bit6 = false, bit7 = false, byte0 = 0)\\\") == (kj::str(root))\", \"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\", kj::str(root)"
               ,(char (*) [290])
                "failed: expected (\"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\") == (kj::str(root))"
               ,(char (*) [230])
                "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
               ,(String *)&local_128);
    kj::Array<char>::~Array((Array<char> *)&local_128);
  }
  local_128._builder.dataSize = root._builder.dataSize;
  local_128._builder.pointerCount = root._builder.pointerCount;
  local_128._builder._38_2_ = root._builder._38_2_;
  local_128._builder.data = root._builder.data;
  local_128._builder.pointers = root._builder.pointers;
  local_128._builder.segment = root._builder.segment;
  local_128._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>
            ((String *)&local_168,(Builder *)&local_128);
  bVar1 = kj::operator==("(u0f0s16 = 123)",(String *)&local_168);
  kj::Array<char>::~Array(&local_168);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_128._builder.dataSize = root._builder.dataSize;
    local_128._builder.pointerCount = root._builder.pointerCount;
    local_128._builder._38_2_ = root._builder._38_2_;
    local_128._builder.data = root._builder.data;
    local_128._builder.pointers = root._builder.pointers;
    local_128._builder.segment = root._builder.segment;
    local_128._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>
              ((String *)&local_168,(Builder *)&local_128);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,599,ERROR,
               "\"failed: expected \" \"(\\\"(u0f0s16 = 123)\\\") == (kj::str(root.getUnion0()))\", \"(u0f0s16 = 123)\", kj::str(root.getUnion0())"
               ,(char (*) [68])
                "failed: expected (\"(u0f0s16 = 123)\") == (kj::str(root.getUnion0()))",
               (char (*) [16])"(u0f0s16 = 123)",(String *)&local_168);
    kj::Array<char>::~Array(&local_168);
  }
  local_128._builder.dataSize = root._builder.dataSize;
  local_128._builder.pointerCount = root._builder.pointerCount;
  local_128._builder._38_2_ = root._builder._38_2_;
  local_128._builder.data = root._builder.data;
  local_128._builder.pointers = root._builder.pointers;
  local_128._builder.segment = root._builder.segment;
  local_128._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>((String *)&local_168,&local_128);
  bVar1 = kj::operator==("(u1f0sp = \"foo\")",(String *)&local_168);
  kj::Array<char>::~Array(&local_168);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_128._builder.dataSize = root._builder.dataSize;
    local_128._builder.pointerCount = root._builder.pointerCount;
    local_128._builder._38_2_ = root._builder._38_2_;
    local_128._builder.data = root._builder.data;
    local_128._builder.pointers = root._builder.pointers;
    local_128._builder.segment = root._builder.segment;
    local_128._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
              ((String *)&local_168,&local_128);
    kj::_::Debug::log<char_const(&)[71],char_const(&)[17],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,600,ERROR,
               "\"failed: expected \" \"(\\\"(u1f0sp = \\\\\\\"foo\\\\\\\")\\\") == (kj::str(root.getUnion1()))\", \"(u1f0sp = \\\"foo\\\")\", kj::str(root.getUnion1())"
               ,(char (*) [71])
                "failed: expected (\"(u1f0sp = \\\"foo\\\")\") == (kj::str(root.getUnion1()))",
               (char (*) [17])"(u1f0sp = \"foo\")",(String *)&local_168);
    kj::Array<char>::~Array(&local_168);
  }
  local_128._builder.dataSize = root._builder.dataSize;
  local_128._builder.pointerCount = root._builder.pointerCount;
  local_128._builder._38_2_ = root._builder._38_2_;
  local_128._builder.data = root._builder.data;
  local_128._builder.pointers = root._builder.pointers;
  local_128._builder.segment = root._builder.segment;
  local_128._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
            ((String *)&local_168,(Builder *)&local_128);
  bVar1 = kj::operator==("(u2f0s1 = true)",(String *)&local_168);
  kj::Array<char>::~Array(&local_168);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_128._builder.dataSize = root._builder.dataSize;
    local_128._builder.pointerCount = root._builder.pointerCount;
    local_128._builder._38_2_ = root._builder._38_2_;
    local_128._builder.data = root._builder.data;
    local_128._builder.pointers = root._builder.pointers;
    local_128._builder.segment = root._builder.segment;
    local_128._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
              ((String *)&local_168,(Builder *)&local_128);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x259,ERROR,
               "\"failed: expected \" \"(\\\"(u2f0s1 = true)\\\") == (kj::str(root.getUnion2()))\", \"(u2f0s1 = true)\", kj::str(root.getUnion2())"
               ,(char (*) [68])
                "failed: expected (\"(u2f0s1 = true)\") == (kj::str(root.getUnion2()))",
               (char (*) [16])"(u2f0s1 = true)",(String *)&local_168);
    kj::Array<char>::~Array(&local_168);
  }
  local_128._builder.dataSize = root._builder.dataSize;
  local_128._builder.pointerCount = root._builder.pointerCount;
  local_128._builder._38_2_ = root._builder._38_2_;
  local_128._builder.data = root._builder.data;
  local_128._builder.pointers = root._builder.pointers;
  local_128._builder.segment = root._builder.segment;
  local_128._builder.capTable = root._builder.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
            ((String *)&local_168,(Builder *)&local_128);
  bVar1 = kj::operator==("(u3f0s64 = 123456789012345678)",(String *)&local_168);
  kj::Array<char>::~Array(&local_168);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    local_128._builder.dataSize = root._builder.dataSize;
    local_128._builder.pointerCount = root._builder.pointerCount;
    local_128._builder._38_2_ = root._builder._38_2_;
    local_128._builder.data = root._builder.data;
    local_128._builder.pointers = root._builder.pointers;
    local_128._builder.segment = root._builder.segment;
    local_128._builder.capTable = root._builder.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
              ((String *)&local_168,(Builder *)&local_128);
    kj::_::Debug::log<char_const(&)[83],char_const(&)[31],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x25a,ERROR,
               "\"failed: expected \" \"(\\\"(u3f0s64 = 123456789012345678)\\\") == (kj::str(root.getUnion3()))\", \"(u3f0s64 = 123456789012345678)\", kj::str(root.getUnion3())"
               ,(char (*) [83])
                "failed: expected (\"(u3f0s64 = 123456789012345678)\") == (kj::str(root.getUnion3()))"
               ,(char (*) [31])"(u3f0s64 = 123456789012345678)",(String *)&local_168);
    kj::Array<char>::~Array(&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, Unions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f0s16(123);
  root.getUnion1().setU1f0sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(123456789012345678ll);

  EXPECT_EQ("("
      "union0 = (u0f0s16 = 123), "
      "union1 = (u1f0sp = \"foo\"), "
      "union2 = (u2f0s1 = true), "
      "union3 = (u3f0s64 = 123456789012345678), "
      "bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, "
      "bit6 = false, bit7 = false, byte0 = 0)",
      kj::str(root));

  EXPECT_EQ("(u0f0s16 = 123)", kj::str(root.getUnion0()));
  EXPECT_EQ("(u1f0sp = \"foo\")", kj::str(root.getUnion1()));
  EXPECT_EQ("(u2f0s1 = true)", kj::str(root.getUnion2()));
  EXPECT_EQ("(u3f0s64 = 123456789012345678)", kj::str(root.getUnion3()));
}